

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall pugi::xml_document::_move(xml_document *this,xml_document *rhs)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  ulong uVar3;
  long lVar4;
  xml_node_struct *pxVar5;
  uintptr_t uVar6;
  long lVar7;
  long *plVar8;
  xml_node_struct *pxVar9;
  ulong uVar10;
  
  pxVar1 = (this->super_xml_node)._root;
  pxVar2 = (rhs->super_xml_node)._root;
  uVar3 = pxVar2->header;
  pxVar9 = pxVar2->first_child;
  uVar6 = (long)pxVar2 - (uVar3 >> 8);
  if (pxVar2[1].header != uVar6) {
    pxVar1[1].header = pxVar2[1].header;
    pxVar1[1].name = pxVar2[1].name;
  }
  pxVar5 = pxVar2[1].parent;
  pxVar1[1].value = pxVar2[1].value;
  pxVar1[1].parent = pxVar5;
  this->_buffer = rhs->_buffer;
  uVar10 = pxVar1->header >> 8;
  if ((*(long *)((long)pxVar1 + (8 - uVar10)) != 0) ||
     (lVar7 = (long)pxVar1 - uVar10, *(long *)(lVar7 + 0x10) != 0)) {
    __assert_fail("doc_page && !doc_page->prev && !doc_page->next",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x1c6e,"void pugi::xml_document::_move(xml_document &)");
  }
  if (*(long *)(uVar6 + 8) != 0) {
    __assert_fail("other_page && !other_page->prev",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x1c71,"void pugi::xml_document::_move(xml_document &)");
  }
  lVar4 = *(long *)(uVar6 + 0x10);
  if (lVar4 != 0) {
    if (*(uintptr_t *)(lVar4 + 8) != uVar6) {
      __assert_fail("page->prev == other_page",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x1c76,"void pugi::xml_document::_move(xml_document &)");
    }
    *(long *)(lVar4 + 8) = lVar7;
    *(long *)(lVar7 + 0x10) = lVar4;
    *(undefined8 *)(uVar6 + 0x10) = 0;
    plVar8 = *(long **)(lVar7 + 0x10);
    if (plVar8 != (long *)0x0) {
      do {
        if ((xml_node_struct *)*plVar8 != pxVar2 + 1) {
          __assert_fail("page->allocator == other",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x1c81,"void pugi::xml_document::_move(xml_document &)");
        }
        *plVar8 = (long)(pxVar1 + 1);
        plVar8 = (long *)plVar8[2];
      } while (plVar8 != (long *)0x0);
    }
  }
  if (pxVar1->first_child == (xml_node_struct *)0x0) {
    pxVar1->first_child = pxVar9;
    while( true ) {
      if (pxVar9 == (xml_node_struct *)0x0) {
        pxVar2->prev_sibling_c = (xml_node_struct *)0x0;
        pxVar2->next_sibling = (xml_node_struct *)0x0;
        pxVar2->parent = (xml_node_struct *)0x0;
        pxVar2->first_child = (xml_node_struct *)0x0;
        pxVar2->name = (char_t *)0x0;
        pxVar2->value = (char_t *)0x0;
        pxVar2->first_attribute = (xml_attribute_struct *)0x0;
        pxVar2->header = (uVar3 & 0xffffffffffffff00) + 1;
        pxVar2[1].header = uVar6;
        pxVar2[1].name = *(char_t **)(uVar6 + 0x18);
        pxVar2[1].value = (char_t *)0x0;
        pxVar2[1].parent = (xml_node_struct *)0x0;
        rhs->_buffer = (char_t *)0x0;
        return;
      }
      if (pxVar9->parent != pxVar2) break;
      pxVar9->parent = pxVar1;
      pxVar9 = pxVar9->next_sibling;
    }
    __assert_fail("node->parent == other",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x1c99,"void pugi::xml_document::_move(xml_document &)");
  }
  __assert_fail("!doc->first_child",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                ,0x1c8d,"void pugi::xml_document::_move(xml_document &)");
}

Assistant:

PUGI_IMPL_FN void xml_document::_move(xml_document& rhs) PUGIXML_NOEXCEPT_IF_NOT_COMPACT
	{
		impl::xml_document_struct* doc = static_cast<impl::xml_document_struct*>(_root);
		impl::xml_document_struct* other = static_cast<impl::xml_document_struct*>(rhs._root);

		// save first child pointer for later; this needs hash access
		xml_node_struct* other_first_child = other->first_child;

	#ifdef PUGIXML_COMPACT
		// reserve space for the hash table up front; this is the only operation that can fail
		// if it does, we have no choice but to throw (if we have exceptions)
		if (other_first_child)
		{
			size_t other_children = 0;
			for (xml_node_struct* node = other_first_child; node; node = node->next_sibling)
				other_children++;

			// in compact mode, each pointer assignment could result in a hash table request
			// during move, we have to relocate document first_child and parents of all children
			// normally there's just one child and its parent has a pointerless encoding but
			// we assume the worst here
			if (!other->_hash->reserve(other_children + 1))
			{
			#ifdef PUGIXML_NO_EXCEPTIONS
				return;
			#else
				throw std::bad_alloc();
			#endif
			}
		}
	#endif

		// move allocation state
		// note that other->_root may point to the embedded document page, in which case we should keep original (empty) state
		if (other->_root != PUGI_IMPL_GETPAGE(other))
		{
			doc->_root = other->_root;
			doc->_busy_size = other->_busy_size;
		}

		// move buffer state
		doc->buffer = other->buffer;
		doc->extra_buffers = other->extra_buffers;
		_buffer = rhs._buffer;

	#ifdef PUGIXML_COMPACT
		// move compact hash; note that the hash table can have pointers to other but they will be "inactive", similarly to nodes removed with remove_child
		doc->hash = other->hash;
		doc->_hash = &doc->hash;

		// make sure we don't access other hash up until the end when we reinitialize other document
		other->_hash = 0;
	#endif

		// move page structure
		impl::xml_memory_page* doc_page = PUGI_IMPL_GETPAGE(doc);
		assert(doc_page && !doc_page->prev && !doc_page->next);

		impl::xml_memory_page* other_page = PUGI_IMPL_GETPAGE(other);
		assert(other_page && !other_page->prev);

		// relink pages since root page is embedded into xml_document
		if (impl::xml_memory_page* page = other_page->next)
		{
			assert(page->prev == other_page);

			page->prev = doc_page;

			doc_page->next = page;
			other_page->next = 0;
		}

		// make sure pages point to the correct document state
		for (impl::xml_memory_page* page = doc_page->next; page; page = page->next)
		{
			assert(page->allocator == other);

			page->allocator = doc;

		#ifdef PUGIXML_COMPACT
			// this automatically migrates most children between documents and prevents ->parent assignment from allocating
			if (page->compact_shared_parent == other)
				page->compact_shared_parent = doc;
		#endif
		}

		// move tree structure
		assert(!doc->first_child);

		doc->first_child = other_first_child;

		for (xml_node_struct* node = other_first_child; node; node = node->next_sibling)
		{
		#ifdef PUGIXML_COMPACT
			// most children will have migrated when we reassigned compact_shared_parent
			assert(node->parent == other || node->parent == doc);

			node->parent = doc;
		#else
			assert(node->parent == other);
			node->parent = doc;
		#endif
		}

		// reset other document
		new (other) impl::xml_document_struct(PUGI_IMPL_GETPAGE(other));
		rhs._buffer = 0;
	}